

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

uint32 re2::Engines(void)

{
  bool bVar1;
  ostream *poVar2;
  Engine i;
  Engine EVar3;
  StringPiece SVar4;
  StringPiece local_1c0;
  LogMessage local_1b0;
  
  if (Engines()::did_parse == '\0') {
    if (CONCAT44(uRam000000000015e434,DAT_0015e430) == 0) {
      Engines::cached_engines = 0xffffffff;
    }
    else {
      for (EVar3 = kEngineBacktrack; EVar3 != kEngineMax; EVar3 = EVar3 + kEngineNFA) {
        local_1b0.severity_ = (int)FLAGS_regexp_engines_abi_cxx11_;
        local_1b0.flushed_ = FLAGS_regexp_engines_abi_cxx11_._4_1_;
        local_1b0._5_3_ = FLAGS_regexp_engines_abi_cxx11_._5_3_;
        local_1b0.str_ = DAT_0015e430._0_1_;
        local_1b0._9_3_ = DAT_0015e430._1_3_;
        SVar4 = EngineName(EVar3);
        bVar1 = StringPiece::contains((StringPiece *)&local_1b0,SVar4);
        if (bVar1) {
          Engines::cached_engines = Engines::cached_engines | 1 << ((byte)EVar3 & 0x1f);
        }
      }
      if (Engines::cached_engines == 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0x43,0);
        std::operator<<((ostream *)&local_1b0.str_,"Warning: no engines enabled.");
        LogMessage::~LogMessage(&local_1b0);
      }
    }
    Engines::cached_engines = Engines::cached_engines & 0xfffffdff;
    for (EVar3 = kEngineBacktrack; EVar3 != kEngineMax; EVar3 = EVar3 + kEngineNFA) {
      if ((Engines::cached_engines >> (EVar3 & 0x1f) & 1) != 0) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0x48,0);
        SVar4 = EngineName(EVar3);
        local_1c0.ptr_ = SVar4.ptr_;
        local_1c0.length_ = SVar4.length_;
        poVar2 = operator<<((ostream *)&local_1b0.str_,&local_1c0);
        std::operator<<(poVar2," enabled");
        LogMessage::~LogMessage(&local_1b0);
      }
    }
    Engines()::did_parse = '\x01';
  }
  return Engines::cached_engines;
}

Assistant:

static uint32 Engines() {
  static bool did_parse = false;
  static uint32 cached_engines = 0;

  if (did_parse)
    return cached_engines;

  if (FLAGS_regexp_engines.empty()) {
    cached_engines = ~0;
  } else {
    for (Engine i = static_cast<Engine>(0); i < kEngineMax; i++)
      if (StringPiece(FLAGS_regexp_engines).contains(EngineName(i)))
        cached_engines |= 1<<i;
  }

  if (cached_engines == 0)
    LOG(INFO) << "Warning: no engines enabled.";
  if (!UsingPCRE)
    cached_engines &= ~(1<<kEnginePCRE);
  for (Engine i = static_cast<Engine>(0); i < kEngineMax; i++) {
    if (cached_engines & (1<<i))
      LOG(INFO) << EngineName(i) << " enabled";
  }

  did_parse = true;
  return cached_engines;
}